

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_RaiseMaster
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  AActor *raiser;
  char *pcVar4;
  AActor *pAVar5;
  bool bVar6;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      raiser = (AActor *)(param->field_0).field_1.a;
      if (raiser != (AActor *)0x0) {
        if ((raiser->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(raiser->super_DThinker).super_DObject._vptr_DObject)(raiser);
          (raiser->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (raiser->super_DThinker).super_DObject.Class;
        bVar6 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar6) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar6 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar6) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d817e;
        }
      }
      if (numparam == 1) {
        param = defaultparam->Array;
        if (param[1].field_0.field_3.Type == '\0') {
LAB_003d8108:
          pAVar5 = (raiser->master).field_0.p;
          if (pAVar5 != (AActor *)0x0) {
            if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
              iVar2 = param[1].field_0.i;
              pAVar5 = (raiser->master).field_0.p;
              if ((pAVar5 != (AActor *)0x0) &&
                 (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                (raiser->master).field_0.p = (AActor *)0x0;
                pAVar5 = (AActor *)0x0;
              }
              if (iVar2 == 0) {
                raiser = (AActor *)0x0;
              }
              P_Thing_Raise(pAVar5,raiser);
            }
            else {
              (raiser->master).field_0.p = (AActor *)0x0;
            }
          }
          return 0;
        }
        pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') goto LAB_003d8108;
        pcVar4 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x11f7,
                    "int AF_AActor_A_RaiseMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d817e:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x11f6,
                "int AF_AActor_A_RaiseMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RaiseMaster)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(copy);

	if (self->master != NULL)
	{
		P_Thing_Raise(self->master, copy ? self : NULL);
	}
	return 0;
}